

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O1

void __thiscall WebServer::cachePage(WebServer *this,string *filename)

{
  size_type *psVar1;
  int iVar2;
  long *plVar3;
  void *__addr;
  mapped_type *this_00;
  size_type *psVar4;
  undefined1 local_100 [8];
  stat fileStat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string path;
  
  psVar1 = &__str._M_string_length;
  fileStat.__glibc_reserved[2] = (__syscall_slong_t)psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(fileStat.__glibc_reserved + 2),HttpConn::root_abi_cxx11_._M_dataplus._M_p,
             HttpConn::root_abi_cxx11_._M_dataplus._M_p + HttpConn::root_abi_cxx11_._M_string_length
            );
  std::__cxx11::string::append((char *)(fileStat.__glibc_reserved + 2));
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)(fileStat.__glibc_reserved + 2),
                              (ulong)(filename->_M_dataplus)._M_p);
  __str.field_2._8_8_ = &path._M_string_length;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    path._M_string_length = *psVar4;
    path.field_2._M_allocated_capacity = plVar3[3];
  }
  else {
    path._M_string_length = *psVar4;
    __str.field_2._8_8_ = (size_type *)*plVar3;
  }
  path._M_dataplus._M_p = (pointer)plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((size_type *)fileStat.__glibc_reserved[2] != psVar1) {
    operator_delete((void *)fileStat.__glibc_reserved[2]);
  }
  iVar2 = stat((char *)__str.field_2._8_8_,(stat *)local_100);
  if ((-1 < iVar2) &&
     (((uint)fileStat.st_nlink & 0xf000) != 0x4000 && ((uint)fileStat.st_nlink & 4) != 0)) {
    iVar2 = open((char *)__str.field_2._8_8_,0);
    __addr = mmap((void *)0x0,fileStat.st_rdev,1,2,iVar2,0);
    close(iVar2);
    if (__addr == (void *)0xffffffffffffffff) {
      __addr = (void *)0xffffffffffffffff;
    }
    else {
      fileStat.__glibc_reserved[2] = (__syscall_slong_t)psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(fileStat.__glibc_reserved + 2),__addr,(long)__addr + fileStat.st_rdev);
      this_00 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&HttpConn::cache__abi_cxx11_,filename);
      std::__cxx11::string::operator=((string *)this_00,(string *)(fileStat.__glibc_reserved + 2));
      if ((size_type *)fileStat.__glibc_reserved[2] != psVar1) {
        operator_delete((void *)fileStat.__glibc_reserved[2]);
      }
    }
    munmap(__addr,fileStat.st_rdev);
  }
  if ((size_type *)__str.field_2._8_8_ != &path._M_string_length) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  return;
}

Assistant:

void WebServer::cachePage(const std::string& filename) {
    struct stat fileStat;
    std::string path = HttpConn::root + "/.." + filename; 
    if (stat(path.c_str(), &fileStat) < 0) {
        return;
    }
    if (!(fileStat.st_mode & S_IROTH)) {
        return;
    }
    if (S_ISDIR(fileStat.st_mode)) {
        return;
    }
    int fd = open(path.c_str(), O_RDONLY);
    void* mmapAddr = mmap(0, fileStat.st_size, PROT_READ, MAP_PRIVATE, fd, 0);
    ::close(fd);
    if (mmapAddr == (void*)-1) {
        munmap(mmapAddr, fileStat.st_size);
        return;
    }

    char* file = static_cast<char*>(mmapAddr); 
    HttpConn::cache_[filename] = std::string(file, file + fileStat.st_size);
    munmap(mmapAddr, fileStat.st_size);
}